

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version.cc
# Opt level: O3

size_t ver_get_new_filename_off(filemgr_magic_t magic)

{
  if (magic == 0xdeadcafebeefbeef) {
    return 0x40;
  }
  if (magic != 0xdeadcafebeefc002) {
    if (magic == 0xdeadcafebeefc001) {
      return 0x48;
    }
    return 0xffffffffffffffff;
  }
  return 0x50;
}

Assistant:

size_t ver_get_new_filename_off(filemgr_magic_t magic) {
    switch(magic) {
        case FILEMGR_MAGIC_000: return 64;
        case FILEMGR_MAGIC_001: return 72;
        case FILEMGR_MAGIC_002: return 80;
    }
    return (size_t) -1;
}